

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.hpp
# Opt level: O2

OrderModifiers duckdb::OrderModifiers::Parse(string *val)

{
  bool bVar1;
  BinderException *pBVar2;
  ushort uVar3;
  ushort uVar4;
  allocator local_12a;
  allocator local_129;
  string local_128;
  string local_108;
  string lcase;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  StringUtil::Lower(&local_48,val);
  ::std::__cxx11::string::string((string *)&local_128,"_",&local_129);
  ::std::__cxx11::string::string((string *)&local_108," ",&local_12a);
  StringUtil::Replace(&lcase,&local_48,&local_128,&local_108);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::string((string *)&local_68,(string *)&lcase);
  ::std::__cxx11::string::string((string *)&local_88,"asc",(allocator *)&local_128);
  bVar1 = StringUtil::StartsWith(&local_68,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  uVar4 = 2;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_a8,(string *)&lcase);
    ::std::__cxx11::string::string((string *)&local_c8,"desc",(allocator *)&local_128);
    bVar1 = StringUtil::StartsWith(&local_a8,&local_c8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    uVar4 = 3;
    if (!bVar1) {
      pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_128,"create_sort_key modifier must start with either ASC or DESC",
                 (allocator *)&local_108);
      BinderException::BinderException(pBVar2,&local_128);
      __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ::std::__cxx11::string::string((string *)&local_128,"nulls first",(allocator *)&local_108);
  bVar1 = StringUtil::EndsWith(&lcase,&local_128);
  ::std::__cxx11::string::~string((string *)&local_128);
  uVar3 = 0x200;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_128,"nulls last",(allocator *)&local_108);
    bVar1 = StringUtil::EndsWith(&lcase,&local_128);
    ::std::__cxx11::string::~string((string *)&local_128);
    uVar3 = 0x300;
    if (!bVar1) {
      pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_128,
                 "create_sort_key modifier must end with either NULLS FIRST or NULLS LAST",
                 (allocator *)&local_108);
      BinderException::BinderException(pBVar2,&local_128);
      __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ::std::__cxx11::string::~string((string *)&lcase);
  return (OrderModifiers)(uVar3 | uVar4);
}

Assistant:

static OrderModifiers Parse(const string &val) {
		auto lcase = StringUtil::Replace(StringUtil::Lower(val), "_", " ");
		OrderType order_type;
		if (StringUtil::StartsWith(lcase, "asc")) {
			order_type = OrderType::ASCENDING;
		} else if (StringUtil::StartsWith(lcase, "desc")) {
			order_type = OrderType::DESCENDING;
		} else {
			throw BinderException("create_sort_key modifier must start with either ASC or DESC");
		}
		OrderByNullType null_type;
		if (StringUtil::EndsWith(lcase, "nulls first")) {
			null_type = OrderByNullType::NULLS_FIRST;
		} else if (StringUtil::EndsWith(lcase, "nulls last")) {
			null_type = OrderByNullType::NULLS_LAST;
		} else {
			throw BinderException("create_sort_key modifier must end with either NULLS FIRST or NULLS LAST");
		}
		return OrderModifiers(order_type, null_type);
	}